

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDBusImageStruct>::eraseFirst
          (QGenericArrayOps<QXdgDBusImageStruct> *this)

{
  long in_RDI;
  
  QArrayDataPointer<QXdgDBusImageStruct>::begin((QArrayDataPointer<QXdgDBusImageStruct> *)0xb3823c);
  QXdgDBusImageStruct::~QXdgDBusImageStruct((QXdgDBusImageStruct *)0xb38244);
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 0x20;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
  return;
}

Assistant:

void eraseFirst() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        this->begin()->~T();
        ++this->ptr;
        --this->size;
    }